

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_row_end(nk_context *ctx)

{
  nk_panel *pnVar1;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  
  if ((((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
      (ctx->current->layout != (nk_panel *)0x0)) &&
     ((pnVar1 = ctx->current->layout, (pnVar1->row).type == NK_LAYOUT_STATIC_ROW ||
      ((pnVar1->row).type == NK_LAYOUT_DYNAMIC_ROW)))) {
    (pnVar1->row).item_width = 0.0;
    (pnVar1->row).item_offset = 0.0;
  }
  return;
}

Assistant:

NK_API void
nk_layout_row_end(struct nk_context *ctx)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
NK_ASSERT(layout->row.type == NK_LAYOUT_STATIC_ROW || layout->row.type == NK_LAYOUT_DYNAMIC_ROW);
if (layout->row.type != NK_LAYOUT_STATIC_ROW && layout->row.type != NK_LAYOUT_DYNAMIC_ROW)
return;
layout->row.item_width = 0;
layout->row.item_offset = 0;
}